

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O2

LispPTR N_OP_aset1(LispPTR data,LispPTR arrayarg,LispPTR inx)

{
  char cVar1;
  DLword *pDVar2;
  uint uVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  byte bVar6;
  LispPTR LVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  
  if ((*(ushort *)((ulong)(arrayarg >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 0xe) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  pLVar4 = NativeAligned4FromLAddr(arrayarg);
  if ((inx & 0xfff0000) == 0xe0000) {
    LVar7 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar5 = NativeAligned4FromLAddr(inx);
    LVar7 = *pLVar5;
    if ((int)LVar7 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar2 = MDStypetbl;
  if ((int)pLVar4[3] <= (int)LVar7) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar8 = LVar7 + (ushort)pLVar4[1];
  uVar10 = *pLVar4 & 0xfffffff;
  uVar11 = (ulong)uVar10;
  cVar1 = *(char *)((long)pLVar4 + 6);
  uVar3 = data >> 8;
  if (cVar1 == '\0') {
    if ((data & 0xfff0000) == 0xe0000) {
      uVar3 = data & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar4 = NativeAligned4FromLAddr(data);
      uVar3 = *pLVar4;
      if ((int)uVar3 < 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    if (1 < uVar3) {
      MachineState.errorexit = 1;
      MachineState.tosvalue = inx;
      return 0xffffffff;
    }
    pbVar9 = (byte *)((long)Lisp_world + (ulong)(uVar8 >> 3) + uVar11 * 2 ^ 3);
    bVar6 = *pbVar9;
    if (uVar3 == 0) {
      bVar6 = bVar6 & (char)(-1 << (~(byte)uVar8 & 7)) - 1U;
    }
    else {
      bVar6 = bVar6 | (byte)(1 << (~(byte)uVar8 & 7));
    }
    *pbVar9 = bVar6;
    return data;
  }
  if (cVar1 == '\x03') {
    if ((data & 0xfff0000) == 0xe0000) {
      uVar3 = data & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar4 = NativeAligned4FromLAddr(data);
      uVar3 = *pLVar4;
      if ((int)uVar3 < 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    if (0xff < uVar3) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    *(char *)((long)Lisp_world + (ulong)uVar8 + uVar11 * 2 ^ 3) = (char)uVar3;
    return data;
  }
  if (cVar1 == '\x04') {
    uVar10 = data;
    if ((data & 0xfff0000) != 0xe0000) {
      if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar4 = NativeAligned4FromLAddr(data);
      uVar10 = *pLVar4;
      if ((int)uVar10 < 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if (0xffff < uVar10) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    *(short *)((ulong)(Lisp_world + uVar11 + uVar8) ^ 2) = (short)uVar10;
    return data;
  }
  if (cVar1 == '\x14') {
    if (((data & 0xfff8000) != 0xf8000) && ((data & 0xfff8000) != 0xe0000)) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
code_r0x001083c8:
    *(short *)((ulong)(Lisp_world + uVar11 + uVar8) ^ 2) = (short)data;
    return data;
  }
  if (cVar1 == '\x16') {
    if ((data & 0xfff0000) == 0xf0000) {
      LVar7 = data | 0xffff0000;
      goto LAB_00108612;
    }
    if ((data & 0xfff0000) == 0xe0000) {
      LVar7 = data & 0xffff;
      goto LAB_00108612;
    }
    if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  else {
    if (cVar1 == 'V') {
      pLVar4 = NativeAligned4FromLAddr(uVar10);
      pLVar4[uVar8] = data;
      return data;
    }
    if (cVar1 != '6') {
      if (cVar1 == 'C') {
        if ((data & 0xfff0000) != 0x70000) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 0xff00) != 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        *(char *)((long)Lisp_world + (ulong)uVar8 + uVar11 * 2 ^ 3) = (char)data;
        return data;
      }
      if (cVar1 != 'D') {
        if (cVar1 != '&') {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pLVar4 = NativeAligned4FromLAddr(uVar10);
        if ((-1 < *(short *)((ulong)(pDVar2 + (pLVar4[uVar8] >> 9)) ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          LVar7 = *Reclaim_cnt_word;
          pLVar4 = NativeAligned4FromLAddr(uVar10);
          if (LVar7 == 0) {
            rec_htfind(pLVar4[uVar8],1);
          }
          else {
            htfind(pLVar4[uVar8],1);
          }
        }
        if ((-1 < *(short *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(data,0);
          }
          else {
            htfind(data,0);
          }
        }
        pLVar4 = NativeAligned4FromLAddr(uVar10);
        pLVar4[uVar8] = data;
        return data;
      }
      if ((data & 0xfff0000) != 0x70000) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      goto code_r0x001083c8;
    }
    if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 3) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pLVar4 = NativeAligned4FromLAddr(data);
  LVar7 = *pLVar4;
LAB_00108612:
  pLVar4 = NativeAligned4FromLAddr(uVar10);
  pLVar4[uVar8] = LVar7;
  return data;
}

Assistant:

LispPTR N_OP_aset1(LispPTR data, LispPTR arrayarg, LispPTR inx) {
  OneDArray *arrayblk;
  LispPTR base;
  int index;

  /*  verify array  */
  if (GetTypeNumber(arrayarg) != TYPE_ONED_ARRAY) ERROR_EXIT(inx);
  arrayblk = (OneDArray *)NativeAligned4FromLAddr(arrayarg);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);
  if (index >= arrayblk->totalsize) ERROR_EXIT(inx);
  index += arrayblk->offset;

  /*  setup base  */
  base = arrayblk->base;

  /*  dispatch on type  */
  aset_switch(arrayblk->typenumber, inx);

doufn:
  ERROR_EXIT(inx);

}